

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strftime(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  tm *ptVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  jx9_value *pjVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  time_t t;
  long local_60;
  uint local_58;
  int nLen;
  char *local_50;
  long local_48;
  ulong local_40;
  char *local_38;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar7 = jx9_value_to_string(*apArg,&nLen);
    if (nLen < 1) {
      pjVar15 = pCtx->pRet;
      jx9MemObjRelease(pjVar15);
      (pjVar15->x).rVal = 0.0;
      pjVar15->iFlags = pjVar15->iFlags & 0xfffffe90U | 8;
    }
    if (nArg == 1) {
      time(&t);
    }
    else {
      pjVar15 = apArg[1];
      if ((pjVar15->iFlags & 2) != 0) {
        jx9MemObjToInteger(pjVar15);
        t = (pjVar15->x).iVal;
        ptVar8 = localtime(&t);
        if (ptVar8 != (tm *)0x0) goto LAB_00133a77;
      }
      time(&t);
    }
LAB_00133a77:
    ptVar8 = localtime(&t);
    uVar2 = ptVar8->tm_hour;
    uVar10 = (ulong)(uint)ptVar8->tm_sec;
    uVar11 = (ulong)(uint)ptVar8->tm_min;
    iVar14 = ptVar8->tm_mon;
    uVar3 = ptVar8->tm_mday;
    uVar4 = ptVar8->tm_yday;
    local_58 = ptVar8->tm_wday;
    uVar17 = ptVar8->tm_year + 0x76c;
    pcVar19 = pcVar7 + nLen;
    uVar1 = iVar14 + 1;
    local_40 = (ulong)(uint)((int)uVar17 % 100);
    local_50 = "AM";
    if (0xc < (int)uVar2) {
      local_50 = "PM";
    }
    local_38 = "am";
    if (0xc < (int)uVar2) {
      local_38 = "pm";
    }
    uVar6 = uVar2 + (((uint)((int)uVar2 / 6 + ((int)uVar2 >> 0x1f)) >> 1) - ((int)uVar2 >> 0x1f)) *
                    -0xc + 1;
    local_48 = (long)(int)(iVar14 + (((uint)(iVar14 / 6 + (iVar14 >> 0x1f)) >> 1) - (iVar14 >> 0x1f)
                                    ) * -0xc);
    local_60 = (long)((int)local_58 % 7);
    do {
      pcVar16 = pcVar7;
      if (pcVar7 < pcVar19) {
        do {
          if (*pcVar16 == '%') break;
          pcVar16 = pcVar16 + 1;
        } while (pcVar16 < pcVar19);
        if (pcVar7 < pcVar16) {
          jx9_value_string(pCtx->pRet,pcVar7,(int)pcVar16 - (int)pcVar7);
        }
      }
      if (pcVar19 <= pcVar16 + 1) goto LAB_00133e94;
      switch(pcVar16[1]) {
      case '%':
        pjVar15 = pCtx->pRet;
        pcVar7 = "%";
        goto LAB_00133e7e;
      default:
        goto switchD_00133bf3_caseD_26;
      case 'A':
        ppcVar9 = zEngDay;
        lVar13 = local_60;
        goto LAB_00133d1b;
      case 'B':
        ppcVar9 = zEngMonth;
        lVar13 = local_48;
LAB_00133d1b:
        pcVar7 = ppcVar9[lVar13];
        pjVar15 = pCtx->pRet;
LAB_00133d23:
        iVar14 = -1;
        goto LAB_00133e83;
      case 'C':
        pcVar7 = "%2d";
        uVar12 = (ulong)(uint)((int)uVar17 / 100);
        break;
      case 'D':
      case 'x':
        pcVar7 = "%02d/%02d/%02d";
        uVar12 = (ulong)uVar3;
        uVar18 = local_40;
        uVar5 = uVar1;
        goto LAB_00133d57;
      case 'F':
        pcVar7 = "%d-%02d-%02d";
        uVar12 = (ulong)uVar1;
        uVar18 = (ulong)uVar3;
        uVar5 = uVar17;
        goto LAB_00133d57;
      case 'G':
      case 'Y':
        pcVar7 = "%4d";
        uVar12 = (ulong)uVar17;
        break;
      case 'H':
        pcVar7 = "%02d";
        uVar12 = (ulong)uVar2;
        break;
      case 'I':
        pcVar7 = "%02d";
        goto LAB_00133dfa;
      case 'M':
        pcVar7 = "%02d";
        uVar12 = uVar11;
        break;
      case 'P':
        pjVar15 = pCtx->pRet;
        pcVar7 = local_38;
        goto LAB_00133e13;
      case 'R':
        jx9_result_string_format(pCtx,"%02d:%02d",(ulong)uVar2,uVar11);
        goto switchD_00133bf3_caseD_26;
      case 'S':
        pcVar7 = "%02d";
        uVar12 = uVar10;
        break;
      case 'T':
      case 'X':
        pcVar7 = "%02d:%02d:%02d";
        uVar12 = uVar11;
        uVar18 = uVar10;
        uVar5 = uVar2;
LAB_00133d57:
        jx9_result_string_format(pCtx,pcVar7,(ulong)uVar5,uVar12,uVar18);
        goto switchD_00133bf3_caseD_26;
      case 'Z':
      case 'z':
        pjVar15 = pCtx->pRet;
        pcVar7 = "GMT";
        goto LAB_00133d23;
      case 'a':
        ppcVar9 = zEngDay;
        lVar13 = local_60;
        goto LAB_00133e57;
      case 'b':
      case 'h':
        ppcVar9 = zEngMonth;
        lVar13 = local_48;
LAB_00133e57:
        pcVar7 = ppcVar9[lVar13];
        pjVar15 = pCtx->pRet;
        iVar14 = 3;
        goto LAB_00133e83;
      case 'c':
        jx9_result_string_format
                  (pCtx,"%d-%02d-%02d %02d:%02d:%02d",(ulong)uVar17,(ulong)uVar1,(ulong)uVar3,
                   (ulong)uVar2,uVar11,uVar10);
        goto switchD_00133bf3_caseD_26;
      case 'd':
      case 'm':
        pcVar7 = "%02d";
        uVar12 = (ulong)uVar1;
        break;
      case 'e':
        pcVar7 = "%2d";
        uVar12 = (ulong)uVar3;
        break;
      case 'g':
      case 'y':
        pcVar7 = "%2d";
        uVar12 = local_40;
        break;
      case 'j':
        pcVar7 = "%03d";
        uVar12 = (ulong)uVar4;
        break;
      case 'l':
        pcVar7 = "%2d";
LAB_00133dfa:
        uVar12 = (ulong)uVar6;
        break;
      case 'n':
        pjVar15 = pCtx->pRet;
        pcVar7 = "\n";
        goto LAB_00133e7e;
      case 'p':
        pjVar15 = pCtx->pRet;
        pcVar7 = local_50;
LAB_00133e13:
        iVar14 = 2;
        goto LAB_00133e83;
      case 'r':
        jx9_result_string_format(pCtx,"%02d:%02d:%02d %s",(ulong)uVar6,uVar11,uVar10,local_50);
        goto switchD_00133bf3_caseD_26;
      case 's':
        time(&t);
        pcVar7 = "%u";
        uVar5 = (uint)t;
        goto LAB_00133dc2;
      case 't':
        pjVar15 = pCtx->pRet;
        pcVar7 = "\t";
LAB_00133e7e:
        iVar14 = 1;
LAB_00133e83:
        jx9_value_string(pjVar15,pcVar7,iVar14);
        goto switchD_00133bf3_caseD_26;
      case 'u':
        pcVar7 = "%d";
        uVar5 = aISO8601[local_60];
LAB_00133dc2:
        uVar12 = (ulong)uVar5;
        break;
      case 'w':
        pcVar7 = "%d";
        uVar12 = (ulong)local_58;
      }
      jx9_result_string_format(pCtx,pcVar7,uVar12);
switchD_00133bf3_caseD_26:
      pcVar7 = pcVar16 + 2;
    } while( true );
  }
  pjVar15 = pCtx->pRet;
  goto LAB_001339bc;
LAB_00133e94:
  pjVar15 = pCtx->pRet;
  if ((pjVar15->sBlob).nByte != 0) {
    return 0;
  }
LAB_001339bc:
  jx9MemObjRelease(pjVar15);
  (pjVar15->x).rVal = 0.0;
  pjVar15->iFlags = pjVar15->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strftime(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	jx9Strftime(pCtx, zFormat, nLen, &sTm);
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing was formatted, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}